

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0,_0>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,
          CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *src)

{
  Index end;
  long start;
  undefined8 local_38;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  end = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  start = (end / 2) * 2;
  unaligned_assign_impl<true>::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (src,dst,0,0);
  for (local_38 = 0; local_38 < start; local_38 = local_38 + 2) {
    DenseCoeffsBase<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
    copyPacket<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,1,1>
              ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)dst,local_38,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)src);
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (src,dst,start,end);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }